

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

float __thiscall V2Synth::getmodsource(V2Synth *this,V2Voice *voice,int chan,int source)

{
  float local_24;
  float in;
  int source_local;
  int chan_local;
  V2Voice *voice_local;
  V2Synth *this_local;
  
  switch(source) {
  case 0:
    local_24 = voice->velo;
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    local_24 = (float)this->chans[chan].ctl[source + -1];
    break;
  case 8:
  case 9:
    local_24 = voice->env[source + -8].out;
    break;
  case 10:
  case 0xb:
    local_24 = voice->lfo[source + -10].out;
    break;
  default:
    local_24 = ((float)voice->note - 48.0) * 2.0;
  }
  return local_24;
}

Assistant:

float getmodsource(const V2Voice *voice, int chan, int source) const
    {
        float in = 0.0f;

        switch (source)
        {
        case 0: // velocity
            COVER("MOD src vel");
            in = voice->velo;
            break;

        case 1: case 2: case 3: case 4: case 5: case 6: case 7: // controller value
            COVER("MOD src ctl");
            in = chans[chan].ctl[source-1];
            break;

        case 8: case 9: // EG output
            COVER("MOD src EG");
            in = voice->env[source-8].out;
            break;

        case 10: case 11: // LFO output
            COVER("MOD src LFO");
            in = voice->lfo[source-10].out;
            break;

        default: // note
            COVER("MOD src note");
            in = 2.0f * (voice->note - 48.0f);
            break;
        }

        return in;
    }